

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# archive_read_support_format_lha.c
# Opt level: O1

wchar_t lzh_make_huffman_table(huffman_conflict *hf)

{
  long lVar1;
  uchar *puVar2;
  uint16_t *puVar3;
  undefined1 auVar4 [16];
  undefined1 auVar5 [16];
  undefined1 auVar6 [16];
  short sVar7;
  undefined1 auVar8 [16];
  undefined1 auVar9 [16];
  undefined1 auVar10 [16];
  undefined1 auVar11 [16];
  undefined1 auVar12 [16];
  uint uVar13;
  wchar_t wVar14;
  long lVar15;
  byte bVar16;
  wchar_t wVar17;
  ulong uVar18;
  htree_t *phVar19;
  uint uVar20;
  ushort uVar21;
  int iVar22;
  uint uVar23;
  uint16_t uVar24;
  long lVar25;
  uint16_t *puVar26;
  wchar_t wVar27;
  ulong uVar28;
  undefined1 auVar29 [16];
  int iVar30;
  undefined1 auVar31 [16];
  undefined1 auVar32 [16];
  undefined1 auVar33 [16];
  undefined1 auVar34 [16];
  undefined1 auVar35 [16];
  undefined1 auVar36 [16];
  undefined1 auVar37 [16];
  undefined1 auVar38 [16];
  undefined1 auVar39 [16];
  undefined1 auVar40 [16];
  int iVar41;
  int iVar46;
  undefined1 auVar42 [16];
  undefined1 auVar43 [16];
  undefined1 auVar44 [16];
  undefined1 auVar45 [16];
  int iVar47;
  int iVar49;
  undefined1 auVar48 [16];
  undefined1 in_XMM11 [16];
  undefined1 auVar50 [16];
  undefined1 auVar51 [16];
  undefined1 in_XMM12 [16];
  undefined1 auVar52 [16];
  wchar_t bitptn [17];
  wchar_t weight [17];
  uint auStack_c8 [20];
  uint auStack_78 [20];
  
  uVar13 = 0x8000;
  uVar18 = 0;
  uVar28 = 0;
  uVar20 = 0;
  do {
    auStack_c8[uVar18 + 1] = uVar20;
    auStack_78[uVar18 + 1] = uVar13;
    lVar15 = uVar18 + 1;
    uVar20 = hf->freq[lVar15] * uVar13 + uVar20;
    uVar18 = uVar18 + 1;
    if (hf->freq[lVar15] != L'\0') {
      uVar28 = uVar18 & 0xffffffff;
    }
    uVar13 = uVar13 >> 1;
  } while (uVar18 != 0x10);
  wVar14 = L'\0';
  if ((uVar20 == 0x10000) && (wVar27 = (wchar_t)uVar28, wVar27 <= hf->tbl_bits)) {
    hf->max_bits = wVar27;
    if ((wVar27 < L'\x10') && (L'\0' < wVar27)) {
      bVar16 = 0x10 - (char)uVar28;
      uVar18 = 1;
      do {
        auStack_c8[uVar18] = (int)auStack_c8[uVar18] >> (bVar16 & 0x1f);
        auStack_78[uVar18] = (int)auStack_78[uVar18] >> (bVar16 & 0x1f);
        uVar18 = uVar18 + 1;
      } while ((uint)(wVar27 + L'\x01') != uVar18);
    }
    wVar14 = L'\0';
    if (L'\n' < wVar27) {
      wVar14 = wVar27 + L'\xfffffff6';
      lVar15 = 1;
      do {
        auStack_c8[lVar15] = (int)auStack_c8[lVar15] >> ((byte)wVar14 & 0x1f);
        auStack_78[lVar15] = (int)auStack_78[lVar15] >> ((byte)wVar14 & 0x1f);
        lVar15 = lVar15 + 1;
      } while (lVar15 != 0xb);
      lVar15 = (long)hf->freq[10] * (long)(int)auStack_78[10] + (long)(int)auStack_c8[10];
      if ((int)lVar15 < 0x400) {
        lVar25 = 0x7fe;
        if (0x7fe < lVar15 * 2) {
          lVar25 = lVar15 * 2;
        }
        memset(hf->tbl + lVar15,0,lVar25 + lVar15 * -2 + 2);
      }
    }
    hf->shift_bits = wVar14;
    puVar2 = hf->bitlen;
    puVar3 = hf->tbl;
    wVar27 = hf->len_avail;
    lVar15 = (long)wVar27;
    hf->tree_used = L'\0';
    auVar12 = _DAT_00165830;
    auVar11 = _DAT_00165820;
    auVar10 = _DAT_00165810;
    auVar9 = _DAT_001657e0;
    auVar8 = _DAT_001657d0;
    if (0 < lVar15) {
      uVar13 = 1 << ((byte)wVar14 - 1 & 0x1f);
      lVar25 = 0;
      do {
        bVar16 = puVar2[lVar25];
        if (bVar16 == 0) {
LAB_0012a2f6:
          iVar41 = 0xf;
        }
        else {
          uVar18 = (ulong)((uint)bVar16 * 4);
          uVar20 = *(uint *)((long)auStack_c8 + uVar18);
          uVar23 = *(uint *)((long)auStack_78 + uVar18);
          *(uint *)((long)auStack_c8 + uVar18) = uVar23 + uVar20;
          uVar24 = (uint16_t)lVar25;
          if (bVar16 < 0xb) {
            iVar41 = 1;
            if (0x400 < (int)(uVar23 + uVar20)) goto LAB_0012a2fb;
            if (0 < (int)uVar23) {
              lVar1 = (ulong)uVar23 - 1;
              auVar29._8_4_ = (int)lVar1;
              auVar29._0_8_ = lVar1;
              auVar29._12_4_ = (int)((ulong)lVar1 >> 0x20);
              puVar26 = puVar3 + (long)(int)uVar20 + ((ulong)uVar23 - 1);
              auVar29 = auVar29 ^ auVar9;
              uVar18 = 0;
              do {
                auVar40._8_4_ = (int)uVar18;
                auVar40._0_8_ = uVar18;
                auVar40._12_4_ = (int)(uVar18 >> 0x20);
                auVar32 = (auVar40 | auVar8) ^ auVar9;
                iVar41 = auVar29._0_4_;
                iVar47 = -(uint)(iVar41 < auVar32._0_4_);
                iVar22 = auVar29._4_4_;
                auVar33._4_4_ = -(uint)(iVar22 < auVar32._4_4_);
                iVar46 = auVar29._8_4_;
                iVar49 = -(uint)(iVar46 < auVar32._8_4_);
                iVar30 = auVar29._12_4_;
                auVar33._12_4_ = -(uint)(iVar30 < auVar32._12_4_);
                auVar43._4_4_ = iVar47;
                auVar43._0_4_ = iVar47;
                auVar43._8_4_ = iVar49;
                auVar43._12_4_ = iVar49;
                auVar50 = pshuflw(in_XMM11,auVar43,0xe8);
                auVar35._4_4_ = -(uint)(auVar32._4_4_ == iVar22);
                auVar35._12_4_ = -(uint)(auVar32._12_4_ == iVar30);
                auVar35._0_4_ = auVar35._4_4_;
                auVar35._8_4_ = auVar35._12_4_;
                auVar52 = pshuflw(in_XMM12,auVar35,0xe8);
                auVar33._0_4_ = auVar33._4_4_;
                auVar33._8_4_ = auVar33._12_4_;
                auVar51 = pshuflw(auVar50,auVar33,0xe8);
                auVar32._8_4_ = 0xffffffff;
                auVar32._0_8_ = 0xffffffffffffffff;
                auVar32._12_4_ = 0xffffffff;
                auVar32 = (auVar51 | auVar52 & auVar50) ^ auVar32;
                auVar32 = packssdw(auVar32,auVar32);
                if ((auVar32 & (undefined1  [16])0x1) != (undefined1  [16])0x0) {
                  *puVar26 = uVar24;
                }
                auVar33 = auVar35 & auVar43 | auVar33;
                auVar32 = packssdw(auVar33,auVar33);
                auVar51._8_4_ = 0xffffffff;
                auVar51._0_8_ = 0xffffffffffffffff;
                auVar51._12_4_ = 0xffffffff;
                auVar32 = packssdw(auVar32 ^ auVar51,auVar32 ^ auVar51);
                if ((auVar32._0_4_ >> 0x10 & 1) != 0) {
                  puVar26[-1] = uVar24;
                }
                auVar32 = (auVar40 | auVar12) ^ auVar9;
                iVar47 = -(uint)(iVar41 < auVar32._0_4_);
                auVar48._4_4_ = -(uint)(iVar22 < auVar32._4_4_);
                iVar49 = -(uint)(iVar46 < auVar32._8_4_);
                auVar48._12_4_ = -(uint)(iVar30 < auVar32._12_4_);
                auVar34._4_4_ = iVar47;
                auVar34._0_4_ = iVar47;
                auVar34._8_4_ = iVar49;
                auVar34._12_4_ = iVar49;
                auVar42._4_4_ = -(uint)(auVar32._4_4_ == iVar22);
                auVar42._12_4_ = -(uint)(auVar32._12_4_ == iVar30);
                auVar42._0_4_ = auVar42._4_4_;
                auVar42._8_4_ = auVar42._12_4_;
                auVar48._0_4_ = auVar48._4_4_;
                auVar48._8_4_ = auVar48._12_4_;
                auVar32 = auVar42 & auVar34 | auVar48;
                auVar32 = packssdw(auVar32,auVar32);
                auVar4._8_4_ = 0xffffffff;
                auVar4._0_8_ = 0xffffffffffffffff;
                auVar4._12_4_ = 0xffffffff;
                auVar32 = packssdw(auVar32 ^ auVar4,auVar32 ^ auVar4);
                if ((auVar32 & (undefined1  [16])0x100000000) != (undefined1  [16])0x0) {
                  puVar26[-2] = uVar24;
                }
                auVar35 = pshufhw(auVar34,auVar34,0x84);
                auVar43 = pshufhw(auVar42,auVar42,0x84);
                auVar33 = pshufhw(auVar35,auVar48,0x84);
                auVar36._8_4_ = 0xffffffff;
                auVar36._0_8_ = 0xffffffffffffffff;
                auVar36._12_4_ = 0xffffffff;
                auVar36 = (auVar33 | auVar43 & auVar35) ^ auVar36;
                auVar35 = packssdw(auVar36,auVar36);
                if ((auVar35 & (undefined1  [16])0x1000000000000) != (undefined1  [16])0x0) {
                  puVar26[-3] = uVar24;
                }
                auVar35 = (auVar40 | auVar11) ^ auVar9;
                iVar47 = -(uint)(iVar41 < auVar35._0_4_);
                auVar38._4_4_ = -(uint)(iVar22 < auVar35._4_4_);
                iVar49 = -(uint)(iVar46 < auVar35._8_4_);
                auVar38._12_4_ = -(uint)(iVar30 < auVar35._12_4_);
                auVar44._4_4_ = iVar47;
                auVar44._0_4_ = iVar47;
                auVar44._8_4_ = iVar49;
                auVar44._12_4_ = iVar49;
                auVar32 = pshuflw(auVar32,auVar44,0xe8);
                auVar37._4_4_ = -(uint)(auVar35._4_4_ == iVar22);
                auVar37._12_4_ = -(uint)(auVar35._12_4_ == iVar30);
                auVar37._0_4_ = auVar37._4_4_;
                auVar37._8_4_ = auVar37._12_4_;
                auVar35 = pshuflw(auVar52 & auVar50,auVar37,0xe8);
                in_XMM12 = auVar35 & auVar32;
                auVar38._0_4_ = auVar38._4_4_;
                auVar38._8_4_ = auVar38._12_4_;
                auVar32 = pshuflw(auVar32,auVar38,0xe8);
                auVar50._8_4_ = 0xffffffff;
                auVar50._0_8_ = 0xffffffffffffffff;
                auVar50._12_4_ = 0xffffffff;
                auVar50 = (auVar32 | in_XMM12) ^ auVar50;
                in_XMM11 = packssdw(auVar50,auVar50);
                if ((in_XMM11 & (undefined1  [16])0x1) != (undefined1  [16])0x0) {
                  puVar26[-4] = uVar24;
                }
                auVar38 = auVar37 & auVar44 | auVar38;
                auVar32 = packssdw(auVar38,auVar38);
                auVar52._8_4_ = 0xffffffff;
                auVar52._0_8_ = 0xffffffffffffffff;
                auVar52._12_4_ = 0xffffffff;
                auVar32 = packssdw(auVar32 ^ auVar52,auVar32 ^ auVar52);
                if ((auVar32 & (undefined1  [16])0x10000) != (undefined1  [16])0x0) {
                  puVar26[-5] = uVar24;
                }
                auVar32 = (auVar40 | auVar10) ^ auVar9;
                iVar41 = -(uint)(iVar41 < auVar32._0_4_);
                auVar45._4_4_ = -(uint)(iVar22 < auVar32._4_4_);
                iVar46 = -(uint)(iVar46 < auVar32._8_4_);
                auVar45._12_4_ = -(uint)(iVar30 < auVar32._12_4_);
                auVar39._4_4_ = iVar41;
                auVar39._0_4_ = iVar41;
                auVar39._8_4_ = iVar46;
                auVar39._12_4_ = iVar46;
                auVar31._4_4_ = -(uint)(auVar32._4_4_ == iVar22);
                auVar31._12_4_ = -(uint)(auVar32._12_4_ == iVar30);
                auVar31._0_4_ = auVar31._4_4_;
                auVar31._8_4_ = auVar31._12_4_;
                auVar45._0_4_ = auVar45._4_4_;
                auVar45._8_4_ = auVar45._12_4_;
                auVar32 = auVar31 & auVar39 | auVar45;
                auVar32 = packssdw(auVar32,auVar32);
                auVar5._8_4_ = 0xffffffff;
                auVar5._0_8_ = 0xffffffffffffffff;
                auVar5._12_4_ = 0xffffffff;
                auVar32 = packssdw(auVar32 ^ auVar5,auVar32 ^ auVar5);
                if ((auVar32 & (undefined1  [16])0x100000000) != (undefined1  [16])0x0) {
                  puVar26[-6] = uVar24;
                }
                auVar40 = pshufhw(auVar39,auVar39,0x84);
                auVar32 = pshufhw(auVar31,auVar31,0x84);
                auVar35 = pshufhw(auVar40,auVar45,0x84);
                auVar6._8_4_ = 0xffffffff;
                auVar6._0_8_ = 0xffffffffffffffff;
                auVar6._12_4_ = 0xffffffff;
                auVar32 = packssdw(auVar32 & auVar40,(auVar35 | auVar32 & auVar40) ^ auVar6);
                if ((auVar32 & (undefined1  [16])0x1000000000000) != (undefined1  [16])0x0) {
                  puVar26[-7] = uVar24;
                }
                uVar18 = uVar18 + 8;
                puVar26 = puVar26 + -8;
              } while ((uVar23 + 7 & 0xfffffff8) != uVar18);
            }
            goto LAB_0012a2f6;
          }
          iVar22 = (int)uVar20 >> ((byte)wVar14 & 0x1f);
          sVar7 = (short)wVar27;
          if (puVar3[iVar22] == 0) {
            wVar17 = hf->tree_used;
            puVar3[iVar22] = (short)wVar17 + sVar7;
            hf->tree_used = wVar17 + L'\x01';
            iVar41 = 1;
            if (wVar17 < hf->tree_avail) {
              phVar19 = hf->tree + wVar17;
              phVar19->left = 0;
              phVar19->right = 0;
              goto LAB_0012a37a;
            }
          }
          else {
            iVar41 = 1;
            wVar17 = (wchar_t)puVar3[iVar22];
            if ((wVar27 <= wVar17) && (wVar17 < hf->tree_used + wVar27)) {
              phVar19 = hf->tree + (wVar17 - wVar27);
LAB_0012a37a:
              uVar21 = (ushort)uVar13;
              if (bVar16 != 0xb) {
                iVar41 = bVar16 - 10;
                uVar23 = uVar13;
                do {
                  if ((uVar23 & 0xffff & uVar20) == 0) {
                    uVar21 = phVar19->right;
                    if (wVar27 <= (int)(uint)uVar21) goto LAB_0012a3e0;
                    wVar17 = hf->tree_used;
                    phVar19->right = (short)wVar17 + sVar7;
LAB_0012a3c2:
                    hf->tree_used = wVar17 + L'\x01';
                    if (hf->tree_avail <= wVar17) {
                      iVar41 = 1;
                      goto LAB_0012a2fb;
                    }
                    phVar19 = hf->tree + wVar17;
                    phVar19->left = 0;
                    phVar19->right = 0;
                  }
                  else {
                    uVar21 = phVar19->left;
                    if ((int)(uint)uVar21 < wVar27) {
                      wVar17 = hf->tree_used;
                      phVar19->left = (short)wVar17 + sVar7;
                      goto LAB_0012a3c2;
                    }
LAB_0012a3e0:
                    phVar19 = hf->tree + ((ulong)uVar21 - lVar15);
                  }
                  uVar23 = (uVar23 & 0xffff) >> 1;
                  iVar41 = iVar41 + -1;
                  uVar21 = (ushort)uVar23;
                } while (1 < iVar41);
              }
              if (((ushort)uVar20 & uVar21) == 0) {
                iVar41 = 1;
                if (phVar19->right == 0) {
                  phVar19 = (htree_t *)&phVar19->right;
                  goto LAB_0012a424;
                }
              }
              else {
                iVar41 = 1;
                if (phVar19->left == 0) {
LAB_0012a424:
                  phVar19->left = uVar24;
                  iVar41 = 0;
                }
              }
            }
          }
        }
LAB_0012a2fb:
        if ((iVar41 != 0xf) && (iVar41 != 0)) {
          return L'\0';
        }
        lVar25 = lVar25 + 1;
      } while (lVar25 != lVar15);
    }
    wVar14 = L'\x01';
  }
  return wVar14;
}

Assistant:

static int
lzh_make_huffman_table(struct huffman *hf)
{
	uint16_t *tbl;
	const unsigned char *bitlen;
	int bitptn[17], weight[17];
	int i, maxbits = 0, ptn, tbl_size, w;
	int diffbits, len_avail;

	/*
	 * Initialize bit patterns.
	 */
	ptn = 0;
	for (i = 1, w = 1 << 15; i <= 16; i++, w >>= 1) {
		bitptn[i] = ptn;
		weight[i] = w;
		if (hf->freq[i]) {
			ptn += hf->freq[i] * w;
			maxbits = i;
		}
	}
	if (ptn != 0x10000 || maxbits > hf->tbl_bits)
		return (0);/* Invalid */

	hf->max_bits = maxbits;

	/*
	 * Cut out extra bits which we won't house in the table.
	 * This preparation reduces the same calculation in the for-loop
	 * making the table.
	 */
	if (maxbits < 16) {
		int ebits = 16 - maxbits;
		for (i = 1; i <= maxbits; i++) {
			bitptn[i] >>= ebits;
			weight[i] >>= ebits;
		}
	}
	if (maxbits > HTBL_BITS) {
		int htbl_max;
		uint16_t *p;

		diffbits = maxbits - HTBL_BITS;
		for (i = 1; i <= HTBL_BITS; i++) {
			bitptn[i] >>= diffbits;
			weight[i] >>= diffbits;
		}
		htbl_max = bitptn[HTBL_BITS] +
		    weight[HTBL_BITS] * hf->freq[HTBL_BITS];
		p = &(hf->tbl[htbl_max]);
		while (p < &hf->tbl[1U<<HTBL_BITS])
			*p++ = 0;
	} else
		diffbits = 0;
	hf->shift_bits = diffbits;

	/*
	 * Make the table.
	 */
	tbl_size = 1 << HTBL_BITS;
	tbl = hf->tbl;
	bitlen = hf->bitlen;
	len_avail = hf->len_avail;
	hf->tree_used = 0;
	for (i = 0; i < len_avail; i++) {
		uint16_t *p;
		int len, cnt;
		uint16_t bit;
		int extlen;
		struct htree_t *ht;

		if (bitlen[i] == 0)
			continue;
		/* Get a bit pattern */
		len = bitlen[i];
		ptn = bitptn[len];
		cnt = weight[len];
		if (len <= HTBL_BITS) {
			/* Calculate next bit pattern */
			if ((bitptn[len] = ptn + cnt) > tbl_size)
				return (0);/* Invalid */
			/* Update the table */
			p = &(tbl[ptn]);
			while (--cnt >= 0)
				p[cnt] = (uint16_t)i;
			continue;
		}

		/*
		 * A bit length is too big to be housed to a direct table,
		 * so we use a tree model for its extra bits.
		 */
		bitptn[len] = ptn + cnt;
		bit = 1U << (diffbits -1);
		extlen = len - HTBL_BITS;
		
		p = &(tbl[ptn >> diffbits]);
		if (*p == 0) {
			*p = len_avail + hf->tree_used;
			ht = &(hf->tree[hf->tree_used++]);
			if (hf->tree_used > hf->tree_avail)
				return (0);/* Invalid */
			ht->left = 0;
			ht->right = 0;
		} else {
			if (*p < len_avail ||
			    *p >= (len_avail + hf->tree_used))
				return (0);/* Invalid */
			ht = &(hf->tree[*p - len_avail]);
		}
		while (--extlen > 0) {
			if (ptn & bit) {
				if (ht->left < len_avail) {
					ht->left = len_avail + hf->tree_used;
					ht = &(hf->tree[hf->tree_used++]);
					if (hf->tree_used > hf->tree_avail)
						return (0);/* Invalid */
					ht->left = 0;
					ht->right = 0;
				} else {
					ht = &(hf->tree[ht->left - len_avail]);
				}
			} else {
				if (ht->right < len_avail) {
					ht->right = len_avail + hf->tree_used;
					ht = &(hf->tree[hf->tree_used++]);
					if (hf->tree_used > hf->tree_avail)
						return (0);/* Invalid */
					ht->left = 0;
					ht->right = 0;
				} else {
					ht = &(hf->tree[ht->right - len_avail]);
				}
			}
			bit >>= 1;
		}
		if (ptn & bit) {
			if (ht->left != 0)
				return (0);/* Invalid */
			ht->left = (uint16_t)i;
		} else {
			if (ht->right != 0)
				return (0);/* Invalid */
			ht->right = (uint16_t)i;
		}
	}
	return (1);
}